

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::HaveCxxStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char **__last;
  bool bVar6;
  char **local_738;
  cmStrCmp local_620;
  byte local_5f9;
  cmStrCmp local_5f8;
  byte local_5d1;
  cmStrCmp local_5d0;
  char **local_5b0;
  char **existingCxxIt;
  ostringstream local_588 [8];
  ostringstream e_2;
  cmStrCmp local_410;
  allocator local_3e9;
  string local_3e8;
  char *local_3c8;
  char *existingCxxStandard;
  undefined1 local_3b8 [5];
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream local_398 [8];
  ostringstream e_1;
  cmStrCmp local_220;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator local_51;
  string local_50;
  char *local_30;
  char *defaultCxxStandard;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  defaultCxxStandard = (char *)feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CMAKE_CXX_STANDARD_DEFAULT",&local_51);
  pcVar1 = GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,
                    "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::ostringstream::str();
    IssueMessage(this,INTERNAL_ERROR,&local_200,false);
    std::__cxx11::string::~string((string *)&local_200);
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  else {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_220,local_30);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_220);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_220);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar4 = std::operator<<((ostream *)local_398,
                               "The CMAKE_CXX_STANDARD_DEFAULT variable contains an invalid value: \""
                              );
      poVar4 = std::operator<<(poVar4,local_30);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,INTERNAL_ERROR,(string *)local_3b8,false);
      std::__cxx11::string::~string((string *)local_3b8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_398);
    }
    else {
      existingCxxStandard._7_1_ = 0;
      existingCxxStandard._6_1_ = 0;
      existingCxxStandard._5_1_ = 0;
      CheckNeededCxxLanguage
                (this,(string *)defaultCxxStandard,(bool *)((long)&existingCxxStandard + 7),
                 (bool *)((long)&existingCxxStandard + 6),(bool *)((long)&existingCxxStandard + 5));
      psVar5 = feature_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e8,"CXX_STANDARD",&local_3e9);
      pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      local_3c8 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        local_3c8 = local_30;
      }
      ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
      ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
      cmStrCmp::cmStrCmp(&local_410,local_3c8);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_410);
      ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
      cmStrCmp::~cmStrCmp(&local_410);
      if (ppcVar2 == ppcVar3) {
        std::__cxx11::ostringstream::ostringstream(local_588);
        poVar4 = std::operator<<((ostream *)local_588,"The CXX_STANDARD property on target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
        poVar4 = std::operator<<(poVar4,local_3c8);
        std::operator<<(poVar4,"\".");
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,(string *)&existingCxxIt,false);
        std::__cxx11::string::~string((string *)&existingCxxIt);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_588);
      }
      else {
        local_5d1 = 0;
        if (local_3c8 == (char *)0x0) {
          local_738 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
        }
        else {
          ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
          ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
          cmStrCmp::cmStrCmp(&local_5d0,local_3c8);
          local_5d1 = 1;
          local_738 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_5d0);
        }
        if ((local_5d1 & 1) != 0) {
          cmStrCmp::~cmStrCmp(&local_5d0);
        }
        local_5b0 = local_738;
        local_5f9 = 0;
        bVar6 = false;
        if ((existingCxxStandard._6_1_ & 1) != 0) {
          ppcVar2 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
          ppcVar3 = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
          cmStrCmp::cmStrCmp(&local_5f8,"11");
          local_5f9 = 1;
          ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_5f8);
          bVar6 = local_738 < ppcVar2;
        }
        if ((local_5f9 & 1) != 0) {
          cmStrCmp::~cmStrCmp(&local_5f8);
        }
        ppcVar2 = local_5b0;
        if (bVar6) {
          this_local._7_1_ = 0;
        }
        else {
          bVar6 = false;
          if ((existingCxxStandard._7_1_ & 1) != 0) {
            ppcVar3 = cmArrayBegin<char_const*,3ul>(&CXX_STANDARDS);
            __last = cmArrayEnd<char_const*,3ul>(&CXX_STANDARDS);
            cmStrCmp::cmStrCmp(&local_620,"98");
            ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,__last,&local_620);
            bVar6 = ppcVar2 < ppcVar3;
            cmStrCmp::~cmStrCmp(&local_620);
          }
          if (bVar6) {
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = 1;
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::HaveCxxStandardAvailable(cmTarget const* target,
                                         const std::string& feature) const
{
  const char* defaultCxxStandard =
    this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
  if (!defaultCxxStandard)
    {
    std::ostringstream e;
    e << "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
      "not fully configured for this compiler.";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
    }
  if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                cmStrCmp(defaultCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
    {
    std::ostringstream e;
    e << "The CMAKE_CXX_STANDARD_DEFAULT variable contains an "
         "invalid value: \"" << defaultCxxStandard << "\".";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    return false;
    }

  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14);

  const char *existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (!existingCxxStandard)
    {
    existingCxxStandard = defaultCxxStandard;
    }

  if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                cmStrCmp(existingCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
    {
    std::ostringstream e;
    e << "The CXX_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  const char * const *existingCxxIt = existingCxxStandard
                                    ? std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp(existingCxxStandard))
                                    : cmArrayEnd(CXX_STANDARDS);

  if (needCxx11 && existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("11")))
    {
    return false;
    }
  else if(needCxx98 && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("98")))
    {
    return false;
    }
  return true;
}